

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lclin.cpp
# Opt level: O1

void __thiscall libDAI::LCLin::LCLin(LCLin *this,FactorGraph *fg,Properties *opts)

{
  _Rb_tree_header *p_Var1;
  _func_int *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer pvVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  VarSet *this_00;
  undefined4 extraout_var_04;
  Var *pVVar8;
  undefined4 extraout_var_05;
  size_type sVar9;
  undefined4 extraout_var_06;
  ulong uVar10;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  Exception *this_01;
  ulong uVar11;
  size_t i;
  long lVar12;
  size_t i_1;
  undefined1 local_a8 [32];
  pointer local_88;
  pointer local_78;
  VarSet local_70;
  VarSet local_50;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG,fg,opts);
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_005e8620;
  (this->Props).updates = SEQFIX;
  (this->Props).cavity = FULL;
  *(undefined8 *)&(this->Props).reinit = 0;
  (this->Props).cortol = 0.0;
  (this->Props).tol = 0.0;
  (this->Props).maxiter = 0;
  (this->Props).verbose = 0;
  (this->Props).damping = 0.0;
  (this->Props).cavainame._M_dataplus._M_p = (pointer)0x0;
  (this->Props).cavainame._M_string_length = 0;
  (this->Props).cavainame.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Props).cavainame.field_2 + 8) = 0;
  *(undefined8 *)
   &(this->Props).cavaiopts.
    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
    ._M_t._M_impl = 0;
  *(undefined8 *)
   &(this->Props).cavaiopts.
    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->Props).cavaiopts.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Props).cavaiopts.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->Props).cavaiopts.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->Props).cavainame._M_dataplus._M_p = (pointer)&(this->Props).cavainame.field_2;
  (this->Props).cavainame._M_string_length = 0;
  (this->Props).cavainame.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->Props).cavaiopts.
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->Props).cavaiopts.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Props).cavaiopts.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Props).cavaiopts.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Props).cavaiopts.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Props).cavaiopts.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_maxdiff = 0.0;
  this->_iterations = 0;
  (this->_phis).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_phis).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_phis).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_gamma).
  super__Vector_base<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_gamma).
  super__Vector_base<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_phis).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_phis).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_gamma).
  super__Vector_base<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_gamma).
  super__Vector_base<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_gamma).
  super__Vector_base<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_beliefs).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_beliefs).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_beliefs).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = initProps(this);
  if (bVar6) {
    iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
              (&this->_phis,
               *(long *)(CONCAT44(extraout_var,iVar7) + 0x48) -
               *(long *)(CONCAT44(extraout_var,iVar7) + 0x40) >> 4);
    lVar12 = 0;
    uVar11 = 0;
    while( true ) {
      iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      p_Var2 = (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5];
      if ((ulong)(*(long *)(CONCAT44(extraout_var_00,iVar7) + 0x48) -
                  *(long *)(CONCAT44(extraout_var_00,iVar7) + 0x40) >> 4) <= uVar11) break;
      iVar7 = (*p_Var2)(this);
      uVar3 = *(undefined8 *)(*(long *)(CONCAT44(extraout_var_01,iVar7) + 0x40) + lVar12);
      iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar4 = *(undefined8 *)(*(long *)(CONCAT44(extraout_var_02,iVar7) + 0x40) + 8 + lVar12);
      iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      this_00 = (VarSet *)
                (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x50))
                          ((long *)CONCAT44(extraout_var_03,iVar7),uVar4);
      iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      pVVar8 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar7) + 0x30))
                                ((long *)CONCAT44(extraout_var_04,iVar7),uVar3);
      VarSet::VarSet(&local_70,pVVar8);
      VarSet::operator/(&local_50,this_00,&local_70);
      TFactor<double>::TFactor((TFactor<double> *)local_a8,&local_50);
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                 &this->_phis,(TFactor<double> *)local_a8);
      if (local_88 != (pointer)0x0) {
        operator_delete(local_88,(long)local_78 - (long)local_88);
      }
      if ((pointer)local_a8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ - local_a8._0_8_);
      }
      if (local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_50._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_70._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_70._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_70._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x10;
    }
    iVar7 = (*p_Var2)(this);
    sVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0x28))
                      ((long *)CONCAT44(extraout_var_05,iVar7));
    std::
    vector<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
    ::resize(&this->_gamma,sVar9);
    lVar12 = 0;
    uVar11 = 0;
    while( true ) {
      iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar7) + 0x28))
                         ((long *)CONCAT44(extraout_var_06,iVar7));
      if (uVar10 <= uVar11) break;
      pvVar5 = (this->_gamma).
               super__Vector_base<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      TFactor<double>::TFactor((TFactor<double> *)local_a8);
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                 ((long)&(pvVar5->
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar12),
                 (TFactor<double> *)local_a8);
      if (local_88 != (pointer)0x0) {
        operator_delete(local_88,(long)local_78 - (long)local_88);
      }
      if ((pointer)local_a8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ - local_a8._0_8_);
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x18;
    }
    iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    sVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar7) + 0x28))
                      ((long *)CONCAT44(extraout_var_07,iVar7));
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
              (&this->_beliefs,sVar9);
    uVar11 = 0;
    while( true ) {
      iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar7) + 0x28))
                         ((long *)CONCAT44(extraout_var_08,iVar7));
      if (uVar10 <= uVar11) break;
      iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      pVVar8 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_09,iVar7) + 0x30))
                                ((long *)CONCAT44(extraout_var_09,iVar7),uVar11);
      TFactor<double>::TFactor((TFactor<double> *)local_a8,pVVar8);
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                 &this->_beliefs,(TFactor<double> *)local_a8);
      if (local_88 != (pointer)0x0) {
        operator_delete(local_88,(long)local_78 - (long)local_88);
      }
      if ((pointer)local_a8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ - local_a8._0_8_);
      }
      uVar11 = uVar11 + 1;
    }
    return;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x10);
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"lclin.cpp, line 82","");
  Exception::Exception(this_01,8,(string *)local_a8);
  __cxa_throw(this_01,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

LCLin::LCLin(const FactorGraph & fg, const Properties &opts) : DAIAlgFG(fg, opts), Props(), _maxdiff(0.0), _iterations(0UL), _phis(), _gamma(), _beliefs() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        // create phis
        _phis.reserve(grm().nrEdges());
        for( size_t iI = 0; iI < grm().nrEdges(); iI++ ) {
            size_t i = grm().edge(iI).first;
            size_t I = grm().edge(iI).second;
            _phis.push_back( Factor( grm().factor(I).vars() / grm().var(i) ) );
        }

        // Construct _gamma
        _gamma.resize( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            _gamma[i].push_back(Factor());

        // create beliefs
        _beliefs.reserve( grm().nrVars() );
        for( size_t i=0; i < grm().nrVars(); i++ )
            _beliefs.push_back(Factor(grm().var(i)));
    }